

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

pid_t phosg::pid_for_name(string *name,bool search_commands,bool exclude_self)

{
  __pid_t _Var1;
  char *pcVar2;
  runtime_error *this;
  out_of_range *this_00;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 with_commands;
  undefined7 in_register_00000011;
  int iVar3;
  __node_base *p_Var4;
  string lower_name;
  string lower_it_name;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  tolower((phosg *)&lower_name,(int)name);
  _Var1 = 0;
  with_commands = extraout_DL;
  if ((int)CONCAT71(in_register_00000011,exclude_self) != 0) {
    _Var1 = getpid();
    with_commands = extraout_DL_00;
  }
  list_processes_abi_cxx11_
            ((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_58,(phosg *)(ulong)search_commands,(bool)with_commands);
  iVar3 = 0;
  p_Var4 = &local_58._M_before_begin;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      ::std::
      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_58);
      if (iVar3 != 0) {
        ::std::__cxx11::string::~string((string *)&lower_name);
        return iVar3;
      }
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      ::std::out_of_range::out_of_range(this_00,"no processes found");
      __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
    }
    tolower((phosg *)&lower_it_name,(int)p_Var4 + 0x10);
    pcVar2 = strstr(lower_it_name._M_dataplus._M_p,lower_name._M_dataplus._M_p);
    if ((pcVar2 != (char *)0x0) && (iVar3 != _Var1)) {
      if (iVar3 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this,"multiple processes found");
        __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = (int)*(size_type *)(p_Var4 + 1);
    }
    ::std::__cxx11::string::~string((string *)&lower_it_name);
  } while( true );
}

Assistant:

pid_t pid_for_name(const string& name, bool search_commands, bool exclude_self) {
  string lower_name = tolower(name);

  pid_t self_pid = exclude_self ? getpid() : 0;

  pid_t pid = 0;
  for (const auto& it : list_processes(search_commands)) {
    string lower_it_name = tolower(it.second);
    if (!strstr(lower_it_name.c_str(), lower_name.c_str())) {
      continue;
    }

    if (pid == self_pid) {
      continue;
    }
    if (pid) {
      throw runtime_error("multiple processes found");
    }
    pid = it.first;
  }

  if (pid) {
    return pid;
  }

  throw out_of_range("no processes found");
}